

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Trunc::~Trunc(Trunc *this)

{
  Trunc *this_local;
  
  PreciseFunc1::~PreciseFunc1(&this->super_PreciseFunc1);
  return;
}

Assistant:

Trunc (void) : PreciseFunc1("trunc", deTrunc) {}